

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_mod.c
# Opt level: O3

void zzHalfMod_fast(word *b,word *a,word *mod,size_t n)

{
  ulong uVar1;
  bool_t bVar2;
  word wVar3;
  ulong uVar4;
  
  bVar2 = zzIsOdd(a,n);
  if (bVar2 == 0) {
    if (n != 0) {
      uVar4 = 0;
      do {
        uVar1 = a[n - 1];
        b[n - 1] = uVar4 << 0x3f | uVar1 >> 1;
        n = n - 1;
        uVar4 = uVar1;
      } while (n != 0);
    }
  }
  else {
    wVar3 = zzAdd(b,a,mod,n);
    if (n != 0) {
      do {
        uVar4 = b[n - 1];
        b[n - 1] = wVar3 << 0x3f | uVar4 >> 1;
        n = n - 1;
        wVar3 = uVar4;
      } while (n != 0);
    }
  }
  return;
}

Assistant:

void FAST(zzHalfMod)(word b[], const word a[], const word mod[], size_t n)
{
	register word carry = 0;
	register word lo;
	// pre
	ASSERT(wwIsSameOrDisjoint(a, b, n));
	ASSERT(wwIsDisjoint(mod, b, n));
	ASSERT(zzIsOdd(mod, n) && mod[n - 1] != 0);
	ASSERT(wwCmp(a, mod, n) < 0);
	// a -- нечетное? => b <- (a + mod) / 2
	if (zzIsOdd(a, n))
	{
		carry = zzAdd(b, a, mod, n);
		while (n--)
			lo = b[n] & WORD_1,
			b[n] = b[n] >> 1 | carry << (B_PER_W - 1),
			carry = lo;
	}
	// a -- четное? => b <- a / 2
	else
		while (n--)
			lo = a[n] & WORD_1,
			b[n] = a[n] >> 1 | carry << (B_PER_W - 1),
			carry = lo;
	// очистка
	lo = carry = 0;
}